

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O0

void appendVariant(QCborContainerPrivate *d,QVariant *variant)

{
  int iVar1;
  QCborContainerPrivate *this;
  char *in_RDI;
  long in_FS_OFFSET;
  QVariant *in_stack_00000010;
  int type;
  QByteArray ba;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  QCborContainerPrivate *in_stack_ffffffffffffff30;
  QString *in_stack_ffffffffffffff38;
  QCborContainerPrivate *in_stack_ffffffffffffff40;
  Type type_00;
  QByteArray *this_00;
  QFlagsStorage<QtCbor::Element::ValueFlag> in_stack_ffffffffffffff7c;
  QByteArray local_58 [2];
  QMetaTypeInterface *local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = (QMetaTypeInterface *)
             QVariant::metaType((QVariant *)
                                CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  iVar1 = QMetaType::id((QMetaType *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  if (iVar1 == 10) {
    QVariant::toString((QVariant *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QCborContainerPrivate::append(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QString::~QString((QString *)0x48c57d);
  }
  else if (iVar1 == 0xc) {
    local_58[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58[0].d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_58[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = local_58;
    QVariant::toByteArray((QVariant *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
    ;
    type_00 = (Type)((ulong)in_stack_ffffffffffffff40 >> 0x20);
    this = (QCborContainerPrivate *)QByteArray::constData((QByteArray *)0x48c5fd);
    QByteArray::size(this_00);
    QFlags<QtCbor::Element::ValueFlag>::QFlags((QFlags<QtCbor::Element::ValueFlag> *)0x48c623);
    QCborContainerPrivate::appendByteData
              (this,in_RDI,(qsizetype)this_00,type_00,(ValueFlags)in_stack_ffffffffffffff7c.i);
    QByteArray::~QByteArray((QByteArray *)0x48c650);
  }
  else {
    QCborValue::fromVariant(in_stack_00000010);
    QCborContainerPrivate::append
              (in_stack_ffffffffffffff30,
               (QCborValue *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    QCborValue::~QCborValue((QCborValue *)in_stack_ffffffffffffff30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void appendVariant(QCborContainerPrivate *d, const QVariant &variant)
{
    // Handle strings and byte arrays directly, to avoid creating a temporary
    // dummy container to hold their data.
    int type = variant.metaType().id();
    if (type == QMetaType::QString) {
        d->append(variant.toString());
    } else if (type == QMetaType::QByteArray) {
        QByteArray ba = variant.toByteArray();
        d->appendByteData(ba.constData(), ba.size(), QCborValue::ByteArray);
    } else {
        // For everything else, use the function below.
        d->append(QCborValue::fromVariant(variant));
    }
}